

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O3

CaseResult * rc::detail::toCaseResult(CaseResult *__return_storage_ptr__,bool value)

{
  undefined7 in_register_00000031;
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string local_58;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000031,value) == 0) {
    paVar2 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Returned false","");
    CaseResult::CaseResult(__return_storage_ptr__,Failure,&local_58);
    _Var1._M_p = local_58._M_dataplus._M_p;
  }
  else {
    paVar2 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Returned true","");
    CaseResult::CaseResult(__return_storage_ptr__,Success,&local_38);
    _Var1._M_p = local_38._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != paVar2) {
    operator_delete(_Var1._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

CaseResult toCaseResult(bool value) {
  return value ? CaseResult(CaseResult::Type::Success, "Returned true")
               : CaseResult(CaseResult::Type::Failure, "Returned false");
}